

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O1

void anon_unknown.dwarf_2299d::verifyPixelsAreEqual<half>
               (DeepImageChannel *c1,DeepImageChannel *c2,int dx,int dy)

{
  float *pfVar1;
  float fVar2;
  int y;
  uint uVar3;
  ImageLevel *pIVar4;
  _func_int **pp_Var5;
  bool bVar6;
  ImageChannel *this;
  ImageChannel *this_00;
  DeepImageLevel *pDVar7;
  DeepImageLevel *pDVar8;
  ArgExc *this_01;
  ulong uVar9;
  int x;
  char *pcVar10;
  int x_00;
  int y_00;
  
  this = (ImageChannel *)
         __dynamic_cast(c1,&Imf_2_5::DeepImageChannel::typeinfo,
                        &Imf_2_5::TypedDeepImageChannel<half>::typeinfo,0);
  if (this != (ImageChannel *)0x0) {
    this_00 = (ImageChannel *)
              __dynamic_cast(c2,&Imf_2_5::DeepImageChannel::typeinfo,
                             &Imf_2_5::TypedDeepImageChannel<half>::typeinfo,0);
    if (this_00 != (ImageChannel *)0x0) {
      pIVar4 = (c1->super_ImageChannel)._level;
      pDVar7 = Imf_2_5::DeepImageChannel::deepLevel(c1);
      pDVar8 = Imf_2_5::DeepImageChannel::deepLevel(c2);
      y = (pIVar4->_dataWindow).min.y;
      if (y <= (pIVar4->_dataWindow).max.y) {
        do {
          x_00 = (pIVar4->_dataWindow).min.x;
          if (x_00 <= (pIVar4->_dataWindow).max.x) {
            y_00 = y + dy;
            do {
              Imf_2_5::ImageChannel::boundsCheck(&(pDVar7->_sampleCounts).super_ImageChannel,x_00,y)
              ;
              uVar3 = (pDVar7->_sampleCounts)._base
                      [(pDVar7->_sampleCounts).super_ImageChannel._pixelsPerRow * y + x_00];
              x = dx + x_00;
              Imf_2_5::ImageChannel::boundsCheck(&(pDVar8->_sampleCounts).super_ImageChannel,x,y_00)
              ;
              if (uVar3 != (pDVar8->_sampleCounts)._base
                           [(pDVar8->_sampleCounts).super_ImageChannel._pixelsPerRow * y_00 + x]) {
                this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
                pcVar10 = "different pixel sample counts";
LAB_00115a13:
                Iex_2_5::ArgExc::ArgExc(this_01,pcVar10);
                __cxa_throw(this_01,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
              }
              Imf_2_5::ImageChannel::boundsCheck(this,x_00,y);
              pp_Var5 = (&(this[1]._level)->_vptr_ImageLevel)[this->_pixelsPerRow * y + x_00];
              Imf_2_5::ImageChannel::boundsCheck(this_00,x,y_00);
              if (0 < (int)uVar3) {
                uVar9 = 0;
                do {
                  fVar2 = *(float *)((long)&half::_toFloat +
                                    (ulong)*(ushort *)((long)pp_Var5 + uVar9 * 2) * 4);
                  pfVar1 = (float *)((long)&half::_toFloat +
                                    (ulong)*(ushort *)
                                            ((long)(&(this_00[1]._level)->_vptr_ImageLevel)
                                                   [this_00->_pixelsPerRow * y_00 + x] + uVar9 * 2)
                                    * 4);
                  if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                    this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
                    pcVar10 = "different sample values";
                    goto LAB_00115a13;
                  }
                  uVar9 = uVar9 + 1;
                } while (uVar3 != uVar9);
              }
              bVar6 = x_00 < (pIVar4->_dataWindow).max.x;
              x_00 = x_00 + 1;
            } while (bVar6);
          }
          bVar6 = y < (pIVar4->_dataWindow).max.y;
          y = y + 1;
        } while (bVar6);
      }
      return;
    }
  }
  __cxa_bad_cast();
}

Assistant:

void
verifyPixelsAreEqual
    (const DeepImageChannel &c1,
     const DeepImageChannel &c2,
     int dx,
     int dy)
{
    const TypedDeepImageChannel<T> &tc1 =
        dynamic_cast <const TypedDeepImageChannel<T>&> (c1);

    const TypedDeepImageChannel<T> &tc2 =
        dynamic_cast <const TypedDeepImageChannel<T>&> (c2);

    const Box2i &dataWindow = c1.level().dataWindow();
    const SampleCountChannel &scc1 = c1.deepLevel().sampleCounts();
    const SampleCountChannel &scc2 = c2.deepLevel().sampleCounts();

    for (int y = dataWindow.min.y; y <= dataWindow.max.y; ++y)
    {
        for (int x = dataWindow.min.x; x <= dataWindow.max.x; ++x)
        {
            int n1 = scc1.at (x, y);
            int n2 = scc2.at (x + dx, y + dy);

            if (n1 != n2)
                throw ArgExc ("different pixel sample counts");

            const T* s1 = tc1.at (x, y);
            const T* s2 = tc2.at (x + dx, y + dy);

            for (int i = 0; i < n1; ++i)
                if (s1[i] != s2[i])
                    throw ArgExc ("different sample values");
        }
    }
}